

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  urlpieces *part;
  ssl_primary_config *dest;
  ssl_primary_config *dest_00;
  curl_proxytype cVar1;
  CURL_NETRC_OPTION CVar2;
  ssl_connection_state sVar3;
  curl_slist *pcVar4;
  conncache *pcVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  size_t sVar8;
  void *pvVar9;
  uint uVar10;
  hostname *phVar11;
  undefined8 __src;
  size_t sVar12;
  byte bVar13;
  char cVar14;
  unsigned_short uVar15;
  CURLUcode CVar16;
  int iVar17;
  CURLcode CVar18;
  CURLcode CVar19;
  uint uVar20;
  curlntlm cVar21;
  size_t sVar22;
  size_t sVar23;
  connectdata *conn;
  ssl_backend_data *psVar24;
  char *pcVar25;
  CURLU *u;
  Curl_handler *pCVar26;
  byte *pbVar27;
  ulong uVar28;
  size_t sVar29;
  char *pcVar30;
  char **ppcVar31;
  long lVar32;
  timediff_t tVar33;
  connectbundle *pcVar34;
  curl_llist_element *pcVar35;
  size_t sVar36;
  connectdata *pcVar37;
  _Bool _Var38;
  ulong uVar39;
  ulong uVar40;
  connectdata *pcVar41;
  size_t sVar42;
  char *pcVar43;
  Curl_easy *pCVar44;
  byte *__s;
  byte *pbVar45;
  byte bVar46;
  byte *pbVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  curltime cVar51;
  curltime newer;
  curltime older;
  connectdata *local_300;
  ulong local_2f8;
  char *local_2f0;
  CURLcode local_2e4;
  curl_llist_element *local_2d0;
  char *local_2c8;
  size_t local_2c0;
  ulong local_298;
  char proxyuser [256];
  char *local_138 [31];
  undefined1 local_39;
  
  sVar22 = Curl_multi_max_host_connections(data->multi);
  sVar23 = Curl_multi_max_total_connections(data->multi);
  *async = false;
  if ((data->change).url == (char *)0x0) {
    return CURLE_URL_MALFORMAT;
  }
  lVar32 = 1;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x768);
  if (conn == (connectdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  sVar36 = Curl_ssl->sizeof_ssl_backend_data;
  psVar24 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar36);
  if (psVar24 == (ssl_backend_data *)0x0) {
    (*Curl_cfree)(conn);
    return CURLE_OUT_OF_MEMORY;
  }
  conn->ssl_extra = psVar24;
  conn->ssl[0].backend = psVar24;
  conn->ssl[1].backend = (ssl_backend_data *)((psVar24->tap_state).master_key + (sVar36 - 0x1c));
  conn->proxy_ssl[0].backend =
       (ssl_backend_data *)((psVar24->tap_state).master_key + sVar36 * 2 + -0x1c);
  conn->proxy_ssl[1].backend =
       (ssl_backend_data *)((psVar24->tap_state).master_key + sVar36 * 3 + -0x1c);
  conn->handler = &Curl_handler_dummy;
  conn->connection_id = -1;
  conn->port = -1;
  conn->remote_port = -1;
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->tempsock[0] = -1;
  conn->tempsock[1] = -1;
  Curl_conncontrol(conn,1);
  cVar51 = Curl_now();
  (conn->created).tv_sec = cVar51.tv_sec;
  (conn->created).tv_usec = cVar51.tv_usec;
  cVar51 = Curl_now();
  (conn->keepalive).tv_sec = cVar51.tv_sec;
  (conn->keepalive).tv_usec = cVar51.tv_usec;
  conn->upkeep_interval_ms = (data->set).upkeep_interval_ms;
  conn->data = data;
  cVar1 = (data->set).proxytype;
  (conn->http_proxy).proxytype = cVar1;
  (conn->socks_proxy).proxytype = CURLPROXY_SOCKS4;
  pcVar25 = (data->set).str[0x15];
  if (pcVar25 == (char *)0x0) {
    (conn->bits).proxy = false;
    bVar48 = false;
    _Var38 = false;
  }
  else {
    bVar48 = *pcVar25 != '\0';
    (conn->bits).proxy = bVar48;
    _Var38 = cVar1 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) && bVar48;
  }
  (conn->bits).httpproxy = _Var38;
  (conn->bits).socksproxy = (_Bool)((_Var38 ^ 1U) & bVar48);
  pcVar25 = (data->set).str[0x16];
  if ((pcVar25 != (char *)0x0) && (*pcVar25 != '\0')) {
    (conn->bits).proxy = true;
    (conn->bits).socksproxy = true;
  }
  (conn->bits).proxy_user_passwd = (data->set).str[0x2f] != (char *)0x0;
  (conn->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (conn->bits).user_passwd = (data->set).str[0x2c] != (char *)0x0;
  (conn->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (conn->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  (conn->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
  (conn->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
  (conn->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
  (conn->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
  (conn->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
  (conn->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
  conn->ip_version = (data->set).ipver;
  _Var38 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var38) && (conn->master_buffer == (char *)0x0)) {
    pcVar25 = (char *)(*Curl_ccalloc)(0x4000,1);
    conn->master_buffer = pcVar25;
    if (pcVar25 == (char *)0x0) goto LAB_0038608a;
  }
  Curl_llist_init(&conn->send_pipe,llist_dtor);
  Curl_llist_init(&conn->recv_pipe,llist_dtor);
  pcVar25 = (data->set).str[8];
  if (pcVar25 != (char *)0x0) {
    pcVar25 = (*Curl_cstrdup)(pcVar25);
    conn->localdev = pcVar25;
    if (pcVar25 == (char *)0x0) {
LAB_0038608a:
      Curl_llist_destroy(&conn->send_pipe,(void *)0x0);
      Curl_llist_destroy(&conn->recv_pipe,(void *)0x0);
      (*Curl_cfree)(conn->master_buffer);
      (*Curl_cfree)(conn->localdev);
      (*Curl_cfree)(conn->ssl_extra);
      (*Curl_cfree)(conn);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar9 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar9;
  *in_connect = conn;
  Curl_up_free(data);
  u = curl_url();
  (data->state).uh = u;
  if (u == (CURLU *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar25 = (data->change).url;
  if ((data->set).str[7] != (char *)0x0) {
    _Var38 = Curl_is_absolute_url(pcVar25,(char *)0x0,8);
    if (_Var38) {
      pcVar25 = (data->change).url;
    }
    else {
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
      }
      pcVar25 = curl_maprintf("%s://%s",(data->set).str[7],(data->change).url);
      if (pcVar25 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (data->change).url = pcVar25;
      (data->change).url_alloc = true;
    }
  }
  CVar16 = curl_url_set(u,CURLUPART_URL,pcVar25,
                        (uint)(data->set).path_as_is * 0x10 +
                        (uint)(data->set).disallow_username_in_url * 0x20 + 0x208);
  switch(CVar16) {
  case CURLUE_OK:
    part = &(data->state).up;
    CVar16 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
    switch(CVar16) {
    case CURLUE_OK:
      pcVar25 = part->scheme;
      pCVar26 = Curl_builtin_scheme(pcVar25);
      if (((pCVar26 == (Curl_handler *)0x0) ||
          (((uint)(data->set).allowed_protocols & pCVar26->protocol) == 0)) ||
         (((data->state).this_is_a_follow == true &&
          (((uint)(data->set).redir_protocols & pCVar26->protocol) == 0)))) {
        Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar25);
        return CURLE_UNSUPPORTED_PROTOCOL;
      }
      conn->given = pCVar26;
      conn->handler = pCVar26;
      ppcVar31 = &(data->state).up.user;
      CVar16 = curl_url_get(u,CURLUPART_USER,ppcVar31,0x40);
      switch(CVar16) {
      case CURLUE_OK:
        pcVar25 = (*Curl_cstrdup)(*ppcVar31);
        conn->user = pcVar25;
        if (pcVar25 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (conn->bits).user_passwd = true;
        break;
      default:
        return CURLE_URL_MALFORMAT;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00386168_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        return CURLE_OUT_OF_MEMORY;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00386168_caseD_8;
      case CURLUE_NO_USER:
        break;
      }
      ppcVar31 = &(data->state).up.password;
      CVar16 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar31,0x40);
      switch(CVar16) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00386168_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
        return CURLE_URL_MALFORMAT;
      case CURLUE_OUT_OF_MEMORY:
        return CURLE_OUT_OF_MEMORY;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00386168_caseD_8;
      case CURLUE_NO_PASSWORD:
        break;
      default:
        if (CVar16 != CURLUE_OK) {
          return CURLE_URL_MALFORMAT;
        }
        pcVar25 = (*Curl_cstrdup)(*ppcVar31);
        conn->passwd = pcVar25;
        if (pcVar25 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (conn->bits).user_passwd = true;
      }
      break;
    default:
      return CURLE_URL_MALFORMAT;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_00386168_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_00386168_caseD_8;
    }
    ppcVar31 = &(data->state).up.options;
    CVar16 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar31,0x40);
    switch(CVar16) {
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_00386168_caseD_5;
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
    case CURLUE_NO_PASSWORD:
      goto switchD_003862f8_caseD_6;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_00386168_caseD_8;
    default:
      if (CVar16 != CURLUE_OK) {
        return CURLE_URL_MALFORMAT;
      }
      pcVar25 = (*Curl_cstrdup)(*ppcVar31);
      conn->options = pcVar25;
      if (pcVar25 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    case CURLUE_NO_OPTIONS:
      CVar16 = curl_url_get(u,CURLUPART_HOST,&(data->state).up.hostname,0);
      if ((CVar16 != CURLUE_OK) && (iVar17 = Curl_strcasecompare("file",part->scheme), iVar17 == 0))
      {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    CVar16 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0);
    switch(CVar16) {
    case CURLUE_OK:
      break;
    default:
      goto switchD_003862f8_caseD_6;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_00386168_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_00386168_caseD_8;
    }
  default:
    return CURLE_URL_MALFORMAT;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_00386168_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_00386168_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_00386168_caseD_8;
  }
  ppcVar31 = &(data->state).up.port;
  local_2e4 = CURLE_COULDNT_RESOLVE_HOST;
  CVar16 = curl_url_get(u,CURLUPART_PORT,ppcVar31,1);
  if (CVar16 == CURLUE_OK) {
    uVar28 = strtoul(*ppcVar31,(char **)0x0,10);
    uVar15 = curlx_ultous(uVar28);
    conn->remote_port = (uint)uVar15;
  }
  else {
    iVar17 = Curl_strcasecompare("file",part->scheme);
    if (iVar17 == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
  pcVar25 = (data->state).up.hostname;
  if (pcVar25 == (char *)0x0) {
    pcVar25 = "";
  }
  if (*pcVar25 == '[') {
    pcVar25 = pcVar25 + 1;
    pbVar27 = (byte *)strchr(pcVar25,0x25);
    (conn->bits).ipv6_ip = true;
    if (pbVar27 != (byte *)0x0) {
      iVar17 = *pbVar27 - 0x25;
      if ((iVar17 == 0) && (iVar17 = pbVar27[1] - 0x32, iVar17 == 0)) {
        iVar17 = 0x35 - (uint)pbVar27[2];
      }
      else {
        iVar17 = -iVar17;
      }
      if (iVar17 == 0) {
        lVar32 = 3;
      }
      else {
        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
      }
      uVar28 = strtoul((char *)(pbVar27 + lVar32),(char **)proxyuser,10);
      __src = proxyuser._0_8_;
      if (*(char *)proxyuser._0_8_ == ']') {
        sVar29 = strlen((char *)proxyuser._0_8_);
        memmove(pbVar27,(void *)__src,sVar29 + 1);
        conn->scope_id = (uint)uVar28;
      }
      else {
        Curl_infof(data,"Invalid IPv6 address format\n");
      }
    }
    pcVar30 = strchr(pcVar25,0x5d);
    if (pcVar30 != (char *)0x0) {
      *pcVar30 = '\0';
    }
  }
  pcVar25 = (*Curl_cstrdup)(pcVar25);
  (conn->host).rawalloc = pcVar25;
  if (pcVar25 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  (conn->host).name = pcVar25;
  uVar20 = (data->set).scope_id;
  if (uVar20 != 0) {
    conn->scope_id = uVar20;
  }
  pcVar25 = (data->set).str[0x39];
  if (pcVar25 != (char *)0x0) {
    pcVar25 = (*Curl_cstrdup)(pcVar25);
    conn->oauth_bearer = pcVar25;
    if (pcVar25 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  pCVar44 = conn->data;
  if ((conn->bits).proxy_user_passwd == true) {
    memset(proxyuser,0,0x100);
    memset(local_138,0,0x100);
    pcVar25 = (pCVar44->set).str[0x2f];
    if (pcVar25 != (char *)0x0) {
      strncpy(proxyuser,pcVar25,0x100);
      proxyuser[0xff] = '\0';
    }
    pcVar25 = (pCVar44->set).str[0x30];
    if (pcVar25 != (char *)0x0) {
      strncpy((char *)local_138,pcVar25,0x100);
      local_39 = 0;
    }
    CVar18 = Curl_urldecode(pCVar44,proxyuser,0,&(conn->http_proxy).user,(size_t *)0x0,false);
    if (CVar18 != CURLE_OK) {
LAB_003865fd:
      local_2f0 = (char *)0x0;
      goto LAB_00386bf2;
    }
    local_2f0 = (char *)0x0;
    CVar18 = Curl_urldecode(pCVar44,(char *)local_138,0,&(conn->http_proxy).passwd,(size_t *)0x0,
                            false);
    pcVar25 = (char *)0x0;
    if (CVar18 == CURLE_OK) goto LAB_0038664a;
  }
  else {
LAB_0038664a:
    pcVar25 = (pCVar44->set).str[0x15];
    if (pcVar25 == (char *)0x0) {
      pcVar25 = (char *)0x0;
LAB_00386693:
      pcVar30 = (pCVar44->set).str[0x16];
      if (pcVar30 == (char *)0x0) {
        local_2f0 = (char *)0x0;
      }
      else {
        local_2f0 = (*Curl_cstrdup)(pcVar30);
        if (local_2f0 == (char *)0x0) {
          local_2f0 = (char *)0x0;
          Curl_failf(pCVar44,"memory shortage");
          CVar18 = CURLE_OUT_OF_MEMORY;
          goto LAB_00386bf5;
        }
      }
      if ((pCVar44->set).str[0x31] == (char *)0x0) {
        pcVar30 = "no_proxy";
        local_2d0 = (curl_llist_element *)curl_getenv("no_proxy");
        if (local_2d0 == (curl_llist_element *)0x0) {
          pcVar30 = "NO_PROXY";
          local_2d0 = (curl_llist_element *)curl_getenv("NO_PROXY");
          if (local_2d0 == (curl_llist_element *)0x0) goto LAB_003866f3;
        }
        Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar30);
      }
      else {
LAB_003866f3:
        local_2d0 = (curl_llist_element *)0x0;
      }
      pcVar35 = (curl_llist_element *)(pCVar44->set).str[0x31];
      if (pcVar35 == (curl_llist_element *)0x0) {
        pcVar35 = local_2d0;
      }
      if ((pcVar35 == (curl_llist_element *)0x0) || (*(char *)pcVar35 == '\0')) {
LAB_00386903:
        if (pcVar25 == (char *)0x0 && local_2f0 == (char *)0x0) {
          pcVar25 = conn->handler->scheme;
          for (lVar32 = 0; cVar14 = pcVar25[lVar32], cVar14 != '\0'; lVar32 = lVar32 + 1) {
            iVar17 = tolower((int)cVar14);
            proxyuser[lVar32] = (char)iVar17;
          }
          builtin_strncpy(proxyuser + lVar32,"_proxy",7);
          pcVar30 = proxyuser;
          pcVar25 = curl_getenv(pcVar30);
          if (pcVar25 == (char *)0x0) {
            pcVar30 = proxyuser;
            iVar17 = Curl_strcasecompare("http_proxy",pcVar30);
            if (iVar17 == 0) {
              Curl_strntoupper(pcVar30,pcVar30,0x80);
              pcVar25 = curl_getenv(pcVar30);
              if (pcVar25 != (char *)0x0) goto LAB_003869cb;
            }
            pcVar30 = "all_proxy";
            pcVar25 = curl_getenv("all_proxy");
            if (pcVar25 != (char *)0x0) goto LAB_003869cb;
            pcVar30 = "ALL_PROXY";
            pcVar25 = curl_getenv("ALL_PROXY");
            if (pcVar25 != (char *)0x0) goto LAB_003869cb;
            pcVar25 = (char *)0x0;
          }
          else {
LAB_003869cb:
            Curl_infof(conn->data,"Uses proxy env variable %s == \'%s\'\n",pcVar30);
          }
          local_2f0 = (char *)0x0;
        }
      }
      else {
        local_2c8 = (conn->host).name;
        iVar17 = Curl_strcasecompare("*",(char *)pcVar35);
        if (iVar17 == 0) {
          sVar29 = strlen((char *)pcVar35);
          if (*local_2c8 == '[') {
            pcVar30 = strchr(local_2c8,0x5d);
            if (pcVar30 == (char *)0x0) goto LAB_00386903;
            local_2c8 = local_2c8 + 1;
            local_2f8 = (long)pcVar30 - (long)local_2c8;
          }
          else {
            local_2f8 = strlen(local_2c8);
          }
          sVar42 = 0;
          while (sVar42 < sVar29) {
            while( true ) {
              if (sVar29 == sVar42) goto LAB_00386903;
              bVar13 = *(byte *)((long)pcVar35 + sVar42);
              local_2c0 = sVar42;
              if ((0x2c < (ulong)bVar13) || ((0x100100000001U >> ((ulong)bVar13 & 0x3f) & 1) == 0))
              break;
              sVar42 = sVar42 + 1;
            }
            while ((sVar12 = sVar29, sVar29 != local_2c0 &&
                   ((0x2c < (ulong)*(byte *)((long)pcVar35 + local_2c0) ||
                    (sVar12 = local_2c0,
                    (0x100100000001U >> ((ulong)*(byte *)((long)pcVar35 + local_2c0) & 0x3f) & 1) ==
                    0))))) {
              local_2c0 = local_2c0 + 1;
            }
            local_2c0 = sVar12;
            uVar28 = (ulong)(bVar13 == 0x2e);
            sVar36 = (local_2c0 - uVar28) - sVar42;
            if (sVar36 <= local_2f8) {
              iVar17 = Curl_strncasecompare
                                 ((char *)((long)pcVar35 + sVar42 + uVar28),
                                  local_2c8 + (uVar28 - local_2c0) + sVar42 + local_2f8,sVar36);
              if ((iVar17 != 0) &&
                 (((local_2c0 - uVar28) - local_2f8 == sVar42 ||
                  (local_2c8[(sVar42 - 1) + (uVar28 - local_2c0) + local_2f8] == '.'))))
              goto LAB_00386790;
            }
            sVar42 = local_2c0 + 1;
          }
          goto LAB_00386903;
        }
LAB_00386790:
        (*Curl_cfree)(pcVar25);
        (*Curl_cfree)(local_2f0);
        local_2f0 = (char *)0x0;
        pcVar25 = (char *)0x0;
      }
      (*Curl_cfree)(local_2d0);
      if (pcVar25 == (char *)0x0) {
LAB_00386a1f:
        pcVar25 = (char *)0x0;
      }
      else if ((*pcVar25 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar25);
        goto LAB_00386a1f;
      }
      if (local_2f0 == (char *)0x0) {
LAB_00386a56:
        if (pcVar25 != (char *)0x0) {
          local_2f0 = (char *)0x0;
          bVar48 = false;
LAB_00386a6b:
          CVar18 = parse_proxy(pCVar44,conn,pcVar25,(conn->http_proxy).proxytype);
          (*Curl_cfree)(pcVar25);
          if (CVar18 != CURLE_OK) goto LAB_00386bf2;
          if (bVar48) goto LAB_00386a97;
          goto LAB_00386ac3;
        }
LAB_00386b46:
        (conn->bits).proxy = false;
        (conn->bits).httpproxy = false;
        (conn->bits).socksproxy = false;
        (conn->bits).proxy_user_passwd = false;
        (conn->bits).tunnel_proxy = false;
      }
      else {
        if ((*local_2f0 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
          (*Curl_cfree)(local_2f0);
          goto LAB_00386a56;
        }
        bVar48 = true;
        if (pcVar25 != (char *)0x0) goto LAB_00386a6b;
LAB_00386a97:
        CVar18 = parse_proxy(pCVar44,conn,local_2f0,(conn->socks_proxy).proxytype);
        (*Curl_cfree)(local_2f0);
        if (CVar18 != CURLE_OK) goto LAB_003865fd;
LAB_00386ac3:
        if ((conn->http_proxy).host.rawalloc == (char *)0x0) {
          (conn->bits).httpproxy = false;
          (conn->bits).tunnel_proxy = false;
          if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
            (conn->bits).proxy = false;
            goto LAB_00386b46;
          }
          if ((conn->socks_proxy).user == (char *)0x0) {
            pcVar25 = (conn->socks_proxy).passwd;
            (conn->socks_proxy).user = (conn->http_proxy).user;
            (conn->http_proxy).user = (char *)0x0;
            (*Curl_cfree)(pcVar25);
            (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
            (conn->http_proxy).passwd = (char *)0x0;
            (conn->bits).socksproxy = true;
            goto LAB_00386bdf;
          }
          (conn->bits).socksproxy = true;
          (conn->bits).proxy = true;
        }
        else {
          if ((conn->handler->protocol & 3) == 0) {
            if (((conn->handler->flags & 0x800) == 0) || ((conn->bits).tunnel_proxy != false)) {
              (conn->bits).tunnel_proxy = true;
            }
            else {
              conn->handler = &Curl_handler_http;
            }
          }
          (conn->bits).httpproxy = true;
          (conn->bits).socksproxy = (conn->socks_proxy).host.rawalloc != (char *)0x0;
LAB_00386bdf:
          (conn->bits).proxy = true;
        }
      }
      local_2f0 = (char *)0x0;
      CVar18 = CURLE_OK;
    }
    else {
      pcVar25 = (*Curl_cstrdup)(pcVar25);
      if (pcVar25 != (char *)0x0) goto LAB_00386693;
      local_2f0 = (char *)0x0;
      Curl_failf(pCVar44,"memory shortage");
      CVar18 = CURLE_OUT_OF_MEMORY;
    }
LAB_00386bf2:
    pcVar25 = (char *)0x0;
  }
LAB_00386bf5:
  (*Curl_cfree)(local_2f0);
  (*Curl_cfree)(pcVar25);
  if (CVar18 != CURLE_OK) {
    return CVar18;
  }
  if (((conn->given->flags & 1) != 0) && ((conn->bits).httpproxy == true)) {
    (conn->bits).tunnel_proxy = true;
  }
  lVar32 = (data->set).use_port;
  if ((lVar32 != 0) && ((data->state).allow_port == true)) {
    conn->remote_port = (uint)lVar32 & 0xffff;
    curl_msnprintf(proxyuser,0x10,"%u");
    CVar16 = curl_url_set((data->state).uh,CURLUPART_PORT,proxyuser,0);
    if (CVar16 != CURLUE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  ppcVar31 = &conn->user;
  pcVar25 = (data->set).str[0x2c];
  bVar48 = pcVar25 != (char *)0x0;
  if (bVar48) {
    (*Curl_cfree)(*ppcVar31);
    pcVar30 = (*Curl_cstrdup)((data->set).str[0x2c]);
    *ppcVar31 = pcVar30;
    if (pcVar30 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->bits).user_passwd = true;
  }
  bVar49 = (data->set).str[0x2d] != (char *)0x0;
  if (bVar49) {
    (*Curl_cfree)(conn->passwd);
    pcVar30 = (*Curl_cstrdup)((data->set).str[0x2d]);
    conn->passwd = pcVar30;
    if (pcVar30 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->bits).user_passwd = true;
  }
  if ((data->set).str[0x2e] != (char *)0x0) {
    (*Curl_cfree)(conn->options);
    pcVar30 = (*Curl_cstrdup)((data->set).str[0x2e]);
    conn->options = pcVar30;
    if (pcVar30 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (conn->bits).netrc = false;
  CVar2 = (data->set).use_netrc;
  if (CVar2 != CURL_NETRC_IGNORED) {
    proxyuser[0] = '\0';
    proxyuser[1] = '\0';
    proxyuser[2] = '\0';
    proxyuser[3] = '\0';
    proxyuser[4] = '\0';
    proxyuser[5] = '\0';
    proxyuser[6] = '\0';
    proxyuser[7] = '\0';
    local_138[0] = (char *)0x0;
    if (CVar2 == CURL_NETRC_OPTIONAL) {
      proxyuser._0_8_ = *ppcVar31;
    }
    iVar17 = Curl_parsenetrc((conn->host).name,(char **)proxyuser,local_138,(data->set).str[0x14]);
    if (0 < iVar17) {
      Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                 (conn->host).name);
      goto LAB_00386dd8;
    }
    if (iVar17 < 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->bits).netrc = true;
    (conn->bits).user_passwd = true;
    if ((data->set).use_netrc == CURL_NETRC_OPTIONAL) {
      if ((proxyuser._0_8_ != 0) && (*ppcVar31 == (char *)0x0)) {
        (*Curl_cfree)((void *)0x0);
        *ppcVar31 = (char *)proxyuser._0_8_;
        bVar48 = true;
      }
      if ((local_138[0] != (char *)0x0) && (conn->passwd == (char *)0x0)) {
        pcVar25 = (char *)0x0;
        goto LAB_00386ec3;
      }
LAB_00386ee9:
      if (bVar48) goto LAB_00386de1;
      goto switchD_00386e14_caseD_0;
    }
    bVar50 = proxyuser._0_8_ != 0;
    if (bVar50) {
      (*Curl_cfree)(*ppcVar31);
      *ppcVar31 = (char *)proxyuser._0_8_;
    }
    bVar48 = bVar50 || bVar48;
    if (local_138[0] == (char *)0x0) goto LAB_00386ee9;
    pcVar25 = conn->passwd;
LAB_00386ec3:
    (*Curl_cfree)(pcVar25);
    conn->passwd = local_138[0];
    bVar49 = true;
    pcVar25 = local_138[0];
    if (bVar48) goto LAB_00386de1;
LAB_00386efe:
    CVar18 = CURLE_URL_MALFORMAT;
    CVar16 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,pcVar25,0);
    switch(CVar16) {
    case CURLUE_OK:
      goto switchD_00386f31_caseD_0;
    default:
      goto switchD_00386f31_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      return CURLE_UNSUPPORTED_PROTOCOL;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_00386168_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
switchD_00386168_caseD_8:
      return CURLE_LOGIN_DENIED;
    }
  }
LAB_00386dd8:
  if (pcVar25 != (char *)0x0) {
LAB_00386de1:
    CVar16 = curl_url_set((data->state).uh,CURLUPART_USER,*ppcVar31,0);
    switch(CVar16) {
    case CURLUE_OK:
      break;
    case CURLUE_BAD_HANDLE:
    case CURLUE_BAD_PARTPOINTER:
    case CURLUE_MALFORMED_INPUT:
    case CURLUE_BAD_PORT_NUMBER:
    case CURLUE_URLDECODE:
      return CURLE_URL_MALFORMAT;
    case CURLUE_UNSUPPORTED_SCHEME:
switchD_00386168_caseD_5:
      return CURLE_UNSUPPORTED_PROTOCOL;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_00386168_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_00386168_caseD_8;
    default:
switchD_003862f8_caseD_6:
      return CURLE_URL_MALFORMAT;
    }
  }
switchD_00386e14_caseD_0:
  if (bVar49) {
    pcVar25 = conn->passwd;
    goto LAB_00386efe;
  }
switchD_00386f31_caseD_0:
  if (((conn->handler->flags & 0x20) == 0) || ((conn->bits).user_passwd == true)) {
    pcVar30 = "";
    pcVar25 = "";
  }
  else {
    pcVar30 = "ftp@example.com";
    pcVar25 = "anonymous";
  }
  if (*ppcVar31 == (char *)0x0) {
    pcVar25 = (*Curl_cstrdup)(pcVar25);
    *ppcVar31 = pcVar25;
    if (pcVar25 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if (conn->passwd == (char *)0x0) {
    pcVar25 = (*Curl_cstrdup)(pcVar30);
    conn->passwd = pcVar25;
    if (pcVar25 == (char *)0x0 && conn->user != (char *)0x0) {
      pcVar25 = (*Curl_cstrdup)("");
      conn->passwd = pcVar25;
      return CURLE_OUT_OF_MEMORY;
    }
    if (pcVar25 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  local_300 = (connectdata *)&(data->set).connect_to;
  pcVar25 = (char *)0x0;
  uVar28 = 0xffffffff;
LAB_00386fcb:
  if ((((int)uVar28 == -1) && (pcVar25 == (char *)0x0)) &&
     (pcVar4 = *(curl_slist **)local_300, pcVar4 != (curl_slist *)0x0)) {
    pcVar25 = pcVar4->data;
    if (*pcVar25 == ':') {
LAB_0038708c:
      if (pcVar25[1] != ':') {
        pcVar30 = strchr(pcVar25 + 1,0x3a);
        if (pcVar30 != (char *)0x0) {
          proxyuser[0] = '\0';
          proxyuser[1] = '\0';
          proxyuser[2] = '\0';
          proxyuser[3] = '\0';
          proxyuser[4] = '\0';
          proxyuser[5] = '\0';
          proxyuser[6] = '\0';
          proxyuser[7] = '\0';
          lVar32 = strtol(pcVar25 + 1,(char **)proxyuser,10);
          if (((char *)proxyuser._0_8_ == pcVar30) && (lVar32 == conn->remote_port)) {
            pcVar25 = pcVar30 + 1;
            goto LAB_00387097;
          }
        }
        goto LAB_00387162;
      }
      pcVar25 = pcVar25 + 2;
LAB_00387097:
      if (*pcVar25 == '\0') goto LAB_00387162;
      pbVar27 = (byte *)(*Curl_cstrdup)(pcVar25);
      if (pbVar27 == (byte *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      __s = pbVar27;
      pbVar47 = pbVar27;
      if (*pbVar27 == 0x5b) {
        pbVar45 = pbVar27 + 2;
        pbVar47 = pbVar27 + 1;
        for (__s = pbVar47; *__s != 0; __s = __s + 1) {
          iVar17 = Curl_isxdigit((uint)*__s);
          if (((iVar17 == 0) && (bVar13 = *__s, bVar13 != 0x2e)) && (bVar13 != 0x3a)) {
            if (bVar13 != 0x25) goto LAB_00387239;
            if (__s[1] - 0x32 == 0) {
              iVar17 = 0x35 - (uint)__s[2];
            }
            else {
              iVar17 = -(__s[1] - 0x32);
            }
            __s = pbVar45;
            if (iVar17 != 0) {
              Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            }
            goto LAB_003871f3;
          }
          pbVar45 = pbVar45 + 1;
        }
        goto LAB_00387247;
      }
      goto LAB_00387258;
    }
    bVar48 = (conn->bits).ipv6_ip != false;
    pcVar30 = "";
    pcVar43 = "";
    if (bVar48) {
      pcVar43 = "[";
    }
    if (bVar48) {
      pcVar30 = "]";
    }
    pcVar30 = curl_maprintf("%s%s%s",pcVar43,(conn->host).name,pcVar30);
    if (pcVar30 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    sVar29 = strlen(pcVar30);
    iVar17 = Curl_strncasecompare(pcVar25,pcVar30,sVar29);
    (*Curl_cfree)(pcVar30);
    if ((iVar17 != 0) && (pcVar25[sVar29] == ':')) {
      pcVar25 = pcVar25 + sVar29;
      goto LAB_0038708c;
    }
LAB_00387162:
    pcVar25 = (char *)0x0;
    uVar28 = 0xffffffff;
    goto LAB_0038716b;
  }
  CVar18 = fix_hostname(conn,&conn->host);
  if (CVar18 != CURLE_OK) {
    return CVar18;
  }
  if (((conn->bits).conn_to_host == true) &&
     (CVar18 = fix_hostname(conn,&conn->conn_to_host), CVar18 != CURLE_OK)) {
    return CVar18;
  }
  if (((conn->bits).httpproxy == true) &&
     (CVar18 = fix_hostname(conn,&(conn->http_proxy).host), CVar18 != CURLE_OK)) {
    return CVar18;
  }
  if (((conn->bits).socksproxy == true) &&
     (CVar18 = fix_hostname(conn,&(conn->socks_proxy).host), CVar18 != CURLE_OK)) {
    return CVar18;
  }
  if (((conn->bits).conn_to_host == true) &&
     (iVar17 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name), iVar17 != 0)) {
    (conn->bits).conn_to_host = false;
  }
  cVar14 = (conn->bits).conn_to_port;
  if (((_Bool)cVar14 == true) && (conn->conn_to_port == conn->remote_port)) {
    (conn->bits).conn_to_port = false;
    cVar14 = '\0';
  }
  if ((((conn->bits).conn_to_host != false) || (cVar14 != '\0')) && ((conn->bits).httpproxy == true)
     ) {
    (conn->bits).tunnel_proxy = true;
  }
  conn->socktype = 1;
  pCVar26 = conn->handler;
  if (pCVar26->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
    CVar18 = (*pCVar26->setup_connection)(conn);
    if (CVar18 != CURLE_OK) {
      return CVar18;
    }
    pCVar26 = conn->handler;
  }
  if (conn->port < 0) {
    conn->port = pCVar26->defport;
  }
  conn->recv[0] = Curl_recv_plain;
  conn->send[0] = Curl_send_plain;
  conn->recv[1] = Curl_recv_plain;
  conn->send[1] = Curl_send_plain;
  (conn->bits).tcp_fastopen = (data->set).tcp_fastopen;
  if ((pCVar26->flags & 0x10) != 0) {
    Curl_persistconninfo(conn);
    CVar18 = (*conn->handler->connect_it)(conn,(_Bool *)proxyuser);
    if (CVar18 == CURLE_OK) {
      conn->data = data;
      (conn->bits).tcpconnect[0] = true;
      CVar19 = Curl_conncache_add_conn((data->state).conn_cache,conn);
      if (CVar19 != CURLE_OK) {
        return CVar19;
      }
      CVar19 = setup_range(data);
      if (CVar19 != CURLE_OK) {
        (*conn->handler->done)(conn,CVar19,false);
        return CVar19;
      }
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
    }
    Curl_init_do(data,conn);
switchD_00386f31_caseD_1:
    return CVar18;
  }
  pcVar25 = (data->set).str[0x1b];
  (data->set).ssl.primary.CApath = (data->set).str[0x1a];
  (data->set).proxy_ssl.primary.CApath = pcVar25;
  (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
  (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
  pcVar25 = (data->set).str[0x25];
  (data->set).ssl.primary.random_file = pcVar25;
  (data->set).proxy_ssl.primary.random_file = pcVar25;
  pcVar25 = (data->set).str[0x24];
  (data->set).ssl.primary.egdsocket = pcVar25;
  (data->set).proxy_ssl.primary.egdsocket = pcVar25;
  (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
  (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
  (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
  (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
  (data->set).ssl.CRLfile = (data->set).str[0x27];
  (data->set).proxy_ssl.CRLfile = (data->set).str[0x28];
  (data->set).ssl.issuercert = (data->set).str[0x29];
  (data->set).proxy_ssl.issuercert = (data->set).str[0x2a];
  pcVar25 = (data->set).str[0];
  pcVar30 = (data->set).str[1];
  (data->set).ssl.cert = pcVar25;
  (data->set).proxy_ssl.cert = pcVar30;
  (data->set).ssl.cert_type = (data->set).str[2];
  (data->set).proxy_ssl.cert_type = (data->set).str[3];
  pcVar43 = (data->set).str[0xe];
  (data->set).ssl.key = (data->set).str[0xd];
  (data->set).proxy_ssl.key = pcVar43;
  (data->set).ssl.key_type = (data->set).str[0x11];
  (data->set).proxy_ssl.key_type = (data->set).str[0x12];
  (data->set).ssl.key_passwd = (data->set).str[0xf];
  (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
  (data->set).ssl.primary.clientcert = pcVar25;
  (data->set).proxy_ssl.primary.clientcert = pcVar30;
  dest = &conn->ssl_config;
  _Var38 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,dest);
  if (!_Var38) {
switchD_00386168_caseD_7:
    return CURLE_OUT_OF_MEMORY;
  }
  dest_00 = &conn->proxy_ssl_config;
  _Var38 = Curl_clone_primary_ssl_config(&(data->set).proxy_ssl.primary,dest_00);
  if (!_Var38) {
    return CURLE_OUT_OF_MEMORY;
  }
  cVar51 = Curl_now();
  pcVar5 = (data->state).conn_cache;
  uVar6 = (pcVar5->last_cleanup).tv_sec;
  uVar7 = (pcVar5->last_cleanup).tv_usec;
  older.tv_usec = uVar7;
  older.tv_sec = uVar6;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar51._0_12_,0);
  newer.tv_usec = SUB124(cVar51._0_12_,8);
  older._12_4_ = 0;
  tVar33 = Curl_timediff(newer,older);
  if (999 < tVar33) {
    proxyuser[8] = '\0';
    proxyuser[9] = '\0';
    proxyuser[10] = '\0';
    proxyuser[0xb] = '\0';
    proxyuser[0xc] = '\0';
    proxyuser[0xd] = '\0';
    proxyuser[0xe] = '\0';
    proxyuser[0xf] = '\0';
    proxyuser._0_8_ = data;
    while (_Var38 = Curl_conncache_foreach
                              (data,(data->state).conn_cache,proxyuser,call_extract_if_dead), _Var38
          ) {
      Curl_disconnect(data,(connectdata *)proxyuser._8_8_,true);
    }
    pcVar5 = (data->state).conn_cache;
    (pcVar5->last_cleanup).tv_sec = cVar51.tv_sec;
    (pcVar5->last_cleanup).tv_usec = cVar51.tv_usec;
  }
  if (((data->set).reuse_fresh != true) || ((data->state).this_is_a_follow == true)) {
    uVar20 = IsPipeliningPossible(data,conn);
    if (((data->state).authhost.want & 0x28) == 0) {
      bVar48 = false;
    }
    else {
      bVar48 = (conn->handler->protocol & 3) != 0;
    }
    if (((conn->bits).proxy_user_passwd == true) && (((data->state).authproxy.want & 0x28) != 0)) {
      bVar49 = (conn->handler->protocol & 3) != 0;
    }
    else {
      bVar49 = false;
    }
    if ((uVar20 & 1) != 0) {
      _Var38 = Curl_pipeline_site_blacklisted(data,conn);
      if (_Var38) {
        uVar20 = uVar20 & 2;
      }
    }
    pcVar34 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
    if (pcVar34 != (connectbundle *)0x0) {
      if (pcVar34->multiuse == 2) {
        pcVar25 = "can multiplex";
LAB_00387906:
        local_298 = 0;
      }
      else {
        pcVar25 = "serially";
        if (data->multi == (Curl_multi *)0x0) goto LAB_00387906;
        local_298 = data->multi->max_pipeline_length;
      }
      phVar11 = &conn->host;
      if ((conn->bits).conn_to_host != false) {
        phVar11 = &conn->conn_to_host;
      }
      pcVar30 = "can pipeline";
      if (pcVar34->multiuse != 1) {
        pcVar30 = pcVar25;
      }
      Curl_infof(data,"Found bundle for host %s: %p [%s]\n",phVar11->name,pcVar34,pcVar30);
      uVar10 = 0;
      if (uVar20 != 0) {
        iVar17 = pcVar34->multiuse;
        if (iVar17 < 1) {
          if ((iVar17 == 0) && ((data->set).pipewait != false)) {
            Curl_infof(data,"Server doesn\'t support multi-use yet, wait\n");
            Curl_conncache_unlock(conn);
LAB_003887c6:
            bVar48 = true;
            goto LAB_003887cd;
          }
          uVar20 = 0;
          Curl_infof(data,"Server doesn\'t support multi-use (yet)\n");
          iVar17 = pcVar34->multiuse;
        }
        if (iVar17 == 1) {
          _Var38 = Curl_pipeline_wanted(data->multi,1);
          if (_Var38) {
            iVar17 = pcVar34->multiuse;
            goto LAB_003879dc;
          }
          pcVar25 = "Could pipeline, but not asked to!\n";
        }
        else {
LAB_003879dc:
          uVar10 = uVar20;
          if ((iVar17 != 2) || (_Var38 = Curl_pipeline_wanted(data->multi,2), _Var38))
          goto LAB_00387a27;
          pcVar25 = "Could multiplex, but not asked to!\n";
        }
        Curl_infof(data,pcVar25);
        uVar10 = 0;
      }
LAB_00387a27:
      local_2d0 = (pcVar34->conn_list).head;
      uVar28 = local_298;
      pcVar37 = (connectdata *)0x0;
      bVar13 = 0;
LAB_00387a80:
      bVar46 = bVar13;
      pcVar41 = pcVar37;
      uVar39 = uVar28;
      if (local_2d0 == (curl_llist_element *)0x0) {
        if (pcVar41 != (connectdata *)0x0) {
          bVar50 = false;
          local_300 = pcVar41;
          goto LAB_003883db;
        }
        Curl_conncache_unlock(conn);
        if ((bVar46 == 0) || ((data->set).pipewait != true)) goto LAB_003887cb;
        Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
        goto LAB_003887c6;
      }
      local_300 = (connectdata *)local_2d0->ptr;
      local_2d0 = local_2d0->next;
      _Var38 = extract_if_dead(local_300,data);
      uVar28 = uVar39;
      pcVar37 = pcVar41;
      bVar13 = bVar46;
      if (_Var38) {
        Curl_disconnect(data,local_300,true);
LAB_00387ac9:
        uVar28 = uVar39;
        pcVar37 = pcVar41;
        bVar13 = bVar46;
        goto LAB_00387a80;
      }
      uVar40 = (local_300->recv_pipe).size + (local_300->send_pipe).size;
      if (uVar10 == 0) {
        if (uVar40 != 0) goto LAB_00387a80;
        iVar17 = local_300->sock[0];
        _Var38 = (local_300->bits).close;
        if (iVar17 == -1 || (_Var38 & 1U) != 0) {
          Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",
                     local_300->connection_id);
          bVar13 = (_Var38 ^ 1U) & iVar17 == -1 | bVar46;
          goto LAB_00387a80;
        }
      }
      else {
        if (((local_300->bits).protoconnstart == true) && ((local_300->bits).close != false))
        goto LAB_00387a80;
        if ((local_300->bits).multiplex == false) {
          pcVar35 = (local_300->send_pipe).head;
          if (pcVar35 == (curl_llist_element *)0x0) {
            pcVar35 = (local_300->recv_pipe).head;
            if (pcVar35 != (curl_llist_element *)0x0) {
LAB_00387bf2:
              pCVar44 = (Curl_easy *)pcVar35->ptr;
              goto LAB_00387bf5;
            }
          }
          else {
            pCVar44 = (Curl_easy *)pcVar35->ptr;
            pcVar35 = (local_300->recv_pipe).head;
            if (pcVar35 == (curl_llist_element *)0x0) {
LAB_00387bf5:
              if (pCVar44 == (Curl_easy *)0x0) goto LAB_00387c19;
            }
            else if (pCVar44 == (Curl_easy *)0x0) goto LAB_00387bf2;
            uVar20 = IsPipeliningPossible(pCVar44,local_300);
            if ((uVar20 & 1) == 0) goto LAB_00387a80;
          }
        }
      }
LAB_00387c19:
      pCVar26 = conn->handler;
      if ((((((local_300->handler->flags ^ pCVar26->flags) & 1) != 0) &&
           ((uVar20 = get_protocol_family(local_300->handler->protocol), uVar20 != pCVar26->protocol
            || (local_300->tls_upgraded != true)))) ||
          ((conn->bits).httpproxy != (local_300->bits).httpproxy)) ||
         ((_Var38 = (conn->bits).socksproxy, _Var38 != (local_300->bits).socksproxy ||
          ((((_Var38 != false &&
             (_Var38 = proxy_info_matches(&conn->socks_proxy,&local_300->socks_proxy), !_Var38)) ||
            ((conn->bits).conn_to_host != (local_300->bits).conn_to_host)) ||
           ((conn->bits).conn_to_port != (local_300->bits).conn_to_port)))))) goto LAB_00387a80;
      if ((conn->bits).httpproxy == true) {
        _Var38 = proxy_info_matches(&conn->http_proxy,&local_300->http_proxy);
        if ((!_Var38) || ((conn->bits).tunnel_proxy != (local_300->bits).tunnel_proxy))
        goto LAB_00387a80;
        if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
          if ((conn->handler->flags & 1) == 0) {
            _Var38 = Curl_ssl_config_matches(dest,&local_300->ssl_config);
            if (!_Var38) goto LAB_00387a80;
            sVar3 = local_300->ssl[0].state;
          }
          else {
            _Var38 = Curl_ssl_config_matches(dest_00,&local_300->proxy_ssl_config);
            if (!_Var38) goto LAB_00387a80;
            sVar3 = local_300->proxy_ssl[0].state;
          }
          if (sVar3 != ssl_connection_complete) goto LAB_00387a80;
        }
      }
      sVar8 = -(local_300->recv_pipe).size;
      sVar36 = (local_300->send_pipe).size;
      if (((uVar10 == 0) && (sVar36 != sVar8)) ||
         ((sVar36 != sVar8 && (local_300->data->multi != conn->data->multi)))) goto LAB_00387a80;
      pcVar25 = conn->localdev;
      if ((pcVar25 != (char *)0x0 || conn->localport != 0) &&
         (((local_300->localport != conn->localport ||
           (local_300->localportrange != conn->localportrange)) ||
          ((pcVar25 != (char *)0x0 &&
           ((local_300->localdev == (char *)0x0 ||
            (iVar17 = strcmp(local_300->localdev,pcVar25), iVar17 != 0)))))))) goto LAB_00387a80;
      pCVar26 = conn->handler;
      uVar20 = pCVar26->flags;
      if (((-1 < (char)uVar20) &&
          ((iVar17 = strcmp(*ppcVar31,local_300->user), iVar17 != 0 ||
           (iVar17 = strcmp(conn->passwd,local_300->passwd), iVar17 != 0)))) ||
         ((((uVar20 & 1) != 0 ||
           (((conn->bits).httpproxy == false || ((conn->bits).tunnel_proxy == true)))) &&
          (((iVar17 = Curl_strcasecompare(pCVar26->scheme,local_300->handler->scheme), iVar17 == 0
            && ((uVar20 = get_protocol_family(local_300->handler->protocol),
                uVar20 != conn->handler->protocol || (local_300->tls_upgraded != true)))) ||
           (((((conn->bits).conn_to_host == true &&
              (iVar17 = Curl_strcasecompare((conn->conn_to_host).name,(local_300->conn_to_host).name
                                           ), iVar17 == 0)) ||
             (((((conn->bits).conn_to_port == true &&
                (conn->conn_to_port != local_300->conn_to_port)) ||
               (iVar17 = Curl_strcasecompare((conn->host).name,(local_300->host).name), iVar17 == 0)
               ) || (conn->remote_port != local_300->remote_port)))) ||
            (((conn->handler->flags & 1) != 0 &&
             ((_Var38 = Curl_ssl_config_matches(dest,&local_300->ssl_config), !_Var38 ||
              (bVar13 = 1, local_300->ssl[0].state != ssl_connection_complete))))))))))))
      goto LAB_00387a80;
      if (bVar48) {
        iVar17 = strcmp(*ppcVar31,local_300->user);
        bVar13 = bVar46;
        if (iVar17 != 0) goto LAB_00387a80;
        cVar21 = strcmp(conn->passwd,local_300->passwd);
      }
      else {
        cVar21 = (local_300->ntlm).state;
      }
      bVar13 = bVar46;
      if (cVar21 != NTLMSTATE_NONE) goto LAB_00387a80;
      if (bVar49) {
        pcVar25 = (local_300->http_proxy).user;
        if ((((pcVar25 == (char *)0x0) ||
             (pcVar30 = (local_300->http_proxy).passwd, pcVar30 == (char *)0x0)) ||
            (iVar17 = strcmp((conn->http_proxy).user,pcVar25), iVar17 != 0)) ||
           (iVar17 = strcmp((conn->http_proxy).passwd,pcVar30), iVar17 != 0)) goto LAB_00387a80;
      }
      else {
        if ((local_300->proxyntlm).state != NTLMSTATE_NONE) goto LAB_00387a80;
        if (!bVar48) {
          bVar50 = false;
          if ((uVar10 == 0) || (bVar50 = false, uVar40 == 0)) goto LAB_003883db;
          if (local_298 - 1 < uVar40) {
            Curl_infof(data,"Pipe is full, skip (%zu)\n",uVar40);
          }
          else {
            _Var38 = Curl_pipeline_penalized(data,local_300);
            if (!_Var38) {
              if (local_298 == 0) {
                bVar50 = false;
                Curl_infof(data,"Multiplexed connection found!\n");
                goto LAB_003883db;
              }
              uVar28 = uVar40;
              pcVar37 = local_300;
              if (uVar39 <= uVar40) goto LAB_00387ac9;
              goto LAB_00387a80;
            }
            Curl_infof(data,"Penalized, skip\n");
          }
          goto LAB_00387ac9;
        }
      }
      if (((bVar48) && ((local_300->ntlm).state != NTLMSTATE_NONE)) ||
         ((pcVar37 = local_300, bVar49 && ((local_300->proxyntlm).state != NTLMSTATE_NONE))))
      goto LAB_00388b2f;
      goto LAB_00387a80;
    }
    Curl_conncache_unlock(conn);
  }
LAB_003887cb:
  bVar48 = false;
LAB_003887cd:
  if ((conn->handler->flags & 0x100) != 0) {
    if ((data->set).ssl_enable_alpn == true) {
      (conn->bits).tls_enable_alpn = true;
    }
    if ((data->set).ssl_enable_npn == true) {
      (conn->bits).tls_enable_npn = true;
    }
  }
  if (bVar48) {
LAB_00388804:
    Curl_infof(data,"No connections available.\n");
    conn_free(conn);
    *in_connect = (connectdata *)0x0;
    return CURLE_NO_CONNECTION_AVAILABLE;
  }
  pcVar34 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
  if ((pcVar34 == (connectbundle *)0x0 || sVar22 == 0) || (pcVar34->num_connections < sVar22)) {
    Curl_conncache_unlock(conn);
  }
  else {
    pcVar37 = Curl_conncache_extract_bundle(data,pcVar34);
    Curl_conncache_unlock(conn);
    if (pcVar37 == (connectdata *)0x0) {
      Curl_infof(data,"No more connections allowed to host: %zu\n",sVar22);
      goto LAB_00388804;
    }
    Curl_disconnect(data,pcVar37,false);
  }
  if ((sVar23 != 0) && (sVar22 = Curl_conncache_size(data), sVar23 <= sVar22)) {
    pcVar37 = Curl_conncache_extract_oldest(data);
    if (pcVar37 == (connectdata *)0x0) {
      Curl_infof(data,"No connections available in cache\n");
      goto LAB_00388804;
    }
    Curl_disconnect(data,pcVar37,false);
  }
  CVar18 = Curl_conncache_add_conn((data->state).conn_cache,conn);
  if (CVar18 != CURLE_OK) {
    return CVar18;
  }
  if ((((data->state).authhost.picked & 0x28) != 0) && ((data->state).authhost.done == true)) {
    Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
    (data->state).authhost.picked = 0;
    (data->state).authhost.done = false;
  }
  local_300 = conn;
  if ((((data->state).authproxy.picked & 0x28) != 0) && ((data->state).authproxy.done == true)) {
    Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
    (data->state).authproxy.picked = 0;
    (data->state).authproxy.done = false;
  }
  goto LAB_00388927;
LAB_003871f3:
  if (*__s == 0) goto LAB_00387247;
  iVar17 = Curl_isalpha((uint)*__s);
  if (((iVar17 == 0) && (iVar17 = Curl_isxdigit((uint)*__s), iVar17 == 0)) &&
     ((bVar13 = *__s, 1 < bVar13 - 0x2d && ((bVar13 != 0x7e && (bVar13 != 0x5f))))))
  goto LAB_00387239;
  __s = __s + 1;
  goto LAB_003871f3;
LAB_00387239:
  if (bVar13 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_00387247:
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_00387258:
  pcVar30 = strchr((char *)__s,0x3a);
  uVar28 = 0xffffffff;
  if (pcVar30 == (char *)0x0) {
LAB_003872bb:
    pcVar25 = (*Curl_cstrdup)((char *)pbVar47);
    CVar18 = CURLE_OK;
    if (pcVar25 == (char *)0x0) {
      pcVar25 = (char *)0x0;
      uVar28 = 0xffffffff;
      bVar48 = false;
      CVar18 = CURLE_OUT_OF_MEMORY;
    }
    else {
      bVar48 = true;
    }
  }
  else {
    proxyuser[0] = '\0';
    proxyuser[1] = '\0';
    proxyuser[2] = '\0';
    proxyuser[3] = '\0';
    proxyuser[4] = '\0';
    proxyuser[5] = '\0';
    proxyuser[6] = '\0';
    proxyuser[7] = '\0';
    *pcVar30 = '\0';
    uVar28 = 0xffffffff;
    if (pcVar30[1] == '\0') goto LAB_003872bb;
    uVar28 = strtol(pcVar30 + 1,(char **)proxyuser,10);
    if (((proxyuser._0_8_ == 0) || (*(char *)proxyuser._0_8_ == '\0')) && (uVar28 < 0x10000))
    goto LAB_003872bb;
    pcVar25 = (char *)0x0;
    Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar30 + 1);
    bVar48 = true;
    uVar28 = 0xffffffff;
    CVar18 = CURLE_OK;
  }
  (*Curl_cfree)(pbVar27);
  if (!bVar48) {
    return CVar18;
  }
  if (pcVar25 == (char *)0x0) {
    pcVar25 = (char *)0x0;
  }
  else if (*pcVar25 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar25;
    (conn->conn_to_host).name = pcVar25;
    (conn->bits).conn_to_host = true;
    Curl_infof(data,"Connecting to hostname: %s\n",pcVar25);
    goto LAB_00387182;
  }
LAB_0038716b:
  (conn->bits).conn_to_host = false;
  (*Curl_cfree)(pcVar25);
  pcVar25 = (char *)0x0;
LAB_00387182:
  if ((int)uVar28 < 0) {
    (conn->bits).conn_to_port = false;
  }
  else {
    conn->conn_to_port = (int)uVar28;
    (conn->bits).conn_to_port = true;
    Curl_infof(data,"Connecting to port: %d\n",uVar28 & 0xffffffff);
  }
  local_300 = (connectdata *)&pcVar4->next;
  goto LAB_00386fcb;
LAB_00388b2f:
  bVar50 = true;
LAB_003883db:
  local_300->data = data;
  Curl_conncache_unlock(conn);
  if (((!bVar50) && (iVar17 = IsPipeliningPossible(data,local_300), iVar17 != 0)) &&
     ((local_300->recv_pipe).size + (local_300->send_pipe).size != 0)) {
    Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
               local_300->connection_id);
    sVar36 = Curl_conncache_bundle_size(local_300);
    if ((sVar36 < sVar22) && (sVar36 = Curl_conncache_size(data), sVar36 < sVar23)) {
      bVar48 = false;
      Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
      Curl_conncache_return_conn(local_300);
      goto LAB_003887cd;
    }
  }
  (*Curl_cfree)((conn->http_proxy).host.rawalloc);
  (*Curl_cfree)((conn->socks_proxy).host.rawalloc);
  Curl_free_primary_ssl_config(dest);
  Curl_free_primary_ssl_config(dest_00);
  local_300->data = conn->data;
  _Var38 = (conn->bits).user_passwd;
  (local_300->bits).user_passwd = _Var38;
  if (_Var38 == true) {
    (*Curl_cfree)(local_300->user);
    local_300->user = (char *)0x0;
    (*Curl_cfree)(local_300->passwd);
    local_300->passwd = (char *)0x0;
    pcVar25 = conn->passwd;
    local_300->user = *ppcVar31;
    local_300->passwd = pcVar25;
    conn->user = (char *)0x0;
    conn->passwd = (char *)0x0;
  }
  _Var38 = (conn->bits).proxy_user_passwd;
  (local_300->bits).proxy_user_passwd = _Var38;
  if (_Var38 == true) {
    (*Curl_cfree)((local_300->http_proxy).user);
    (local_300->http_proxy).user = (char *)0x0;
    (*Curl_cfree)((local_300->socks_proxy).user);
    (local_300->socks_proxy).user = (char *)0x0;
    (*Curl_cfree)((local_300->http_proxy).passwd);
    (local_300->http_proxy).passwd = (char *)0x0;
    (*Curl_cfree)((local_300->socks_proxy).passwd);
    (local_300->socks_proxy).passwd = (char *)0x0;
    pcVar25 = (conn->http_proxy).passwd;
    (local_300->http_proxy).user = (conn->http_proxy).user;
    (local_300->http_proxy).passwd = pcVar25;
    pcVar25 = (conn->socks_proxy).passwd;
    (local_300->socks_proxy).user = (conn->socks_proxy).user;
    (local_300->socks_proxy).passwd = pcVar25;
    (conn->socks_proxy).user = (char *)0x0;
    (conn->socks_proxy).passwd = (char *)0x0;
    (conn->http_proxy).user = (char *)0x0;
    (conn->http_proxy).passwd = (char *)0x0;
  }
  (*Curl_cfree)((local_300->host).rawalloc);
  (local_300->host).rawalloc = (char *)0x0;
  (*Curl_cfree)((local_300->conn_to_host).rawalloc);
  (local_300->conn_to_host).rawalloc = (char *)0x0;
  pcVar25 = (conn->host).rawalloc;
  pcVar30 = (conn->host).encalloc;
  pcVar43 = (conn->host).dispname;
  (local_300->host).name = (conn->host).name;
  (local_300->host).dispname = pcVar43;
  (local_300->host).rawalloc = pcVar25;
  (local_300->host).encalloc = pcVar30;
  pcVar25 = (conn->conn_to_host).encalloc;
  pcVar30 = (conn->conn_to_host).name;
  pcVar43 = (conn->conn_to_host).dispname;
  (local_300->conn_to_host).rawalloc = (conn->conn_to_host).rawalloc;
  (local_300->conn_to_host).encalloc = pcVar25;
  (local_300->conn_to_host).name = pcVar30;
  (local_300->conn_to_host).dispname = pcVar43;
  iVar17 = conn->conn_to_port;
  local_300->remote_port = conn->remote_port;
  local_300->conn_to_port = iVar17;
  Curl_persistconninfo(local_300);
  (local_300->bits).reuse = true;
  (*Curl_cfree)(conn->user);
  conn->user = (char *)0x0;
  (*Curl_cfree)(conn->passwd);
  conn->passwd = (char *)0x0;
  (*Curl_cfree)(conn->options);
  conn->options = (char *)0x0;
  (*Curl_cfree)((conn->http_proxy).user);
  (conn->http_proxy).user = (char *)0x0;
  (*Curl_cfree)((conn->socks_proxy).user);
  (conn->socks_proxy).user = (char *)0x0;
  (*Curl_cfree)((conn->http_proxy).passwd);
  (conn->http_proxy).passwd = (char *)0x0;
  (*Curl_cfree)((conn->socks_proxy).passwd);
  (conn->socks_proxy).passwd = (char *)0x0;
  (*Curl_cfree)(conn->localdev);
  conn->localdev = (char *)0x0;
  Curl_llist_destroy(&conn->send_pipe,(void *)0x0);
  Curl_llist_destroy(&conn->recv_pipe,(void *)0x0);
  (*Curl_cfree)(conn->master_buffer);
  conn->master_buffer = (char *)0x0;
  (*Curl_cfree)(conn->ssl_extra);
  (*Curl_cfree)(conn);
  *in_connect = local_300;
  pcVar25 = "host";
  if ((local_300->bits).proxy != false) {
    pcVar25 = "proxy";
  }
  lVar32 = 0x120;
  if (((local_300->socks_proxy).host.name == (char *)0x0) &&
     (lVar32 = 0x160, (local_300->http_proxy).host.name == (char *)0x0)) {
    lVar32 = 0xd8;
  }
  Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",local_300->connection_id,
             pcVar25,*(undefined8 *)((local_300->chunk).hexbuffer + lVar32 + -0x20));
LAB_00388927:
  Curl_init_do(data,local_300);
  CVar18 = setup_range(data);
  if (CVar18 != CURLE_OK) {
    return CVar18;
  }
  local_300->seek_func = (data->set).seek_func;
  local_300->seek_client = (data->set).seek_client;
  tVar33 = Curl_timeleft(data,(curltime *)0x0,true);
  if ((local_300->bits).reuse == true) {
    *async = false;
    return CURLE_OK;
  }
  if ((local_300->bits).proxy == false) {
    lVar32 = 0xc0;
    if ((local_300->bits).conn_to_host != false) {
      lVar32 = 0xe8;
    }
    iVar17 = *(int *)(local_300->primary_ip + (ulong)(local_300->bits).conn_to_port * 4 + -10);
    local_300->port = (long)iVar17;
    iVar17 = Curl_resolv_timeout(local_300,*(char **)((local_300->chunk).hexbuffer + lVar32 + -0x10)
                                 ,iVar17,(Curl_dns_entry **)proxyuser,tVar33);
    if (iVar17 == -2) goto LAB_00388adc;
    if (iVar17 == 1) goto LAB_00388ab4;
    if (proxyuser._0_8_ == 0) {
      Curl_failf(data,"Couldn\'t resolve host \'%s\'",
                 *(undefined8 *)((local_300->chunk).hexbuffer + lVar32 + -8));
      goto LAB_00388af8;
    }
  }
  else {
    uVar28 = (ulong)(((local_300->bits).socksproxy ^ 1) << 6);
    iVar17 = Curl_resolv_timeout(local_300,
                                 *(char **)((long)&(local_300->socks_proxy).host.name + uVar28),
                                 (int)local_300->port,(Curl_dns_entry **)proxyuser,tVar33);
    if (iVar17 == -2) {
LAB_00388adc:
      local_2e4 = CURLE_OPERATION_TIMEDOUT;
      goto LAB_00388af8;
    }
    if (iVar17 == 1) {
LAB_00388ab4:
      *async = true;
    }
    else if (proxyuser._0_8_ == 0) {
      Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                 *(undefined8 *)((local_300->chunk).hexbuffer + ((uVar28 | 0x108) - 8)));
      local_2e4 = CURLE_COULDNT_RESOLVE_PROXY;
      goto LAB_00388af8;
    }
  }
  local_2e4 = CURLE_OK;
LAB_00388af8:
  local_300->dns_entry = (Curl_dns_entry *)proxyuser._0_8_;
  return local_2e4;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *conn_temp = NULL;
  bool reuse;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;
  size_t max_host_connections = Curl_multi_max_host_connections(data->multi);
  size_t max_total_connections = Curl_multi_max_total_connections(data->multi);

  *async = FALSE;

  /*************************************************************
   * Check input data
   *************************************************************/
  if(!data->change.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  result = parseurlandfillconn(data, conn);
  if(result)
    goto out;

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(conn->unix_domain_socket == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(conn);
  if(result)
    goto out;
#endif

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so they
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn, &conn->user, &conn->passwd,
                          &conn->options);
  if(result)
    goto out;

  result = set_login(conn); /* default credentials */
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;

  /*************************************************************
   * IDN-fix the hostnames
   *************************************************************/
  result = fix_hostname(conn, &conn->host);
  if(result)
    goto out;
  if(conn->bits.conn_to_host) {
    result = fix_hostname(conn, &conn->conn_to_host);
    if(result)
      goto out;
  }
  if(conn->bits.httpproxy) {
    result = fix_hostname(conn, &conn->http_proxy.host);
    if(result)
      goto out;
  }
  if(conn->bits.socksproxy) {
    result = fix_hostname(conn, &conn->socks_proxy.host);
    if(result)
      goto out;
  }

  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-fixed.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(conn);
  if(result)
    goto out;

  conn->recv[FIRSTSOCKET] = Curl_recv_plain;
  conn->send[FIRSTSOCKET] = Curl_send_plain;
  conn->recv[SECONDARYSOCKET] = Curl_recv_plain;
  conn->send[SECONDARYSOCKET] = Curl_send_plain;

  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /***********************************************************************
   * file: is a special case in that it doesn't need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    Curl_persistconninfo(conn);
    result = conn->handler->connect_it(conn, &done);

    /* Setup a "faked" transfer that'll do nothing */
    if(!result) {
      conn->data = data;
      conn->bits.tcpconnect[FIRSTSOCKET] = TRUE; /* we are "connected */

      result = Curl_conncache_add_conn(data->state.conn_cache, conn);
      if(result)
        goto out;

      /*
       * Setup whatever necessary for a resumed transfer
       */
      result = setup_range(data);
      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(conn, result, FALSE);
        goto out;
      }

      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, /* no download */
                          -1, NULL); /* no upload */
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Get a cloned copy of the SSL config situation stored in the
     connection struct. But to get this going nicely, we must first make
     sure that the strings in the master copy are pointing to the correct
     strings in the session handle strings array!

     Keep in mind that the pointers in the master copy are pointing to strings
     that will be freed as part of the Curl_easy struct, but all cloned
     copies will be separately allocated.
  */
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_ORIG];
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_ORIG];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.ssl.primary.random_file = data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.proxy_ssl.primary.random_file =
    data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.proxy_ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];
  data->set.ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_PROXY];

  data->set.ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_ORIG];
  data->set.proxy_ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_ORIG];
  data->set.proxy_ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.ssl.cert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.cert = data->set.str[STRING_CERT_PROXY];
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE_ORIG];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.ssl.key = data->set.str[STRING_KEY_ORIG];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE_ORIG];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_ORIG];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
#ifdef USE_TLS_SRP
  data->set.ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_ORIG];
  data->set.proxy_ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_ORIG];
  data->set.proxy_ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif

  if(!Curl_clone_primary_ssl_config(&data->set.ssl.primary,
     &conn->ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  if(!Curl_clone_primary_ssl_config(&data->set.proxy_ssl.primary,
                                    &conn->proxy_ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  prune_dead_connections(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * re-use an already existing one or if we have to create a
   * new one.
   *************************************************************/

  DEBUGASSERT(conn->user);
  DEBUGASSERT(conn->passwd);

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a re-used connection
     already (which happens due to follow-location or during a HTTP
     authentication phase). */
  if(data->set.reuse_fresh && !data->state.this_is_a_follow)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &conn_temp, &force_reuse, &waitpipe);

  /* If we found a reusable connection that is now marked as in use, we may
     still want to open a new connection if we are pipelining. */
  if(reuse && !force_reuse && IsPipeliningPossible(data, conn_temp)) {
    size_t pipelen = conn_temp->send_pipe.size + conn_temp->recv_pipe.size;
    if(pipelen > 0) {
      infof(data, "Found connection %ld, with requests in the pipe (%zu)\n",
            conn_temp->connection_id, pipelen);

      if(Curl_conncache_bundle_size(conn_temp) < max_host_connections &&
         Curl_conncache_size(data) < max_total_connections) {
        /* We want a new connection anyway */
        reuse = FALSE;

        infof(data, "We can reuse, but we want a new connection anyway\n");
        Curl_conncache_return_conn(conn_temp);
      }
    }
  }

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection
     * in the conn_temp variable and thus we need to cleanup the one we
     * just allocated before we can move along and use the previously
     * existing one.
     */
    reuse_conn(conn, conn_temp);
#ifdef USE_SSL
    free(conn->ssl_extra);
#endif
    free(conn);          /* we don't need this anymore */
    conn = conn_temp;
    *in_connect = conn;

    infof(data, "Re-using existing connection! (#%ld) with %s %s\n",
          conn->connection_id,
          conn->bits.proxy?"proxy":"host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
                                       conn->host.dispname);
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */

    if(conn->handler->flags & PROTOPT_ALPN_NPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
      if(data->set.ssl_enable_npn)
        conn->bits.tls_enable_npn = TRUE;
    }

    if(waitpipe)
      /* There is a connection that *might* become usable for pipelining
         "soon", and we wait for that */
      connections_available = FALSE;
    else {
      /* this gets a lock on the conncache */
      struct connectbundle *bundle =
        Curl_conncache_find_bundle(conn, data->state.conn_cache);

      if(max_host_connections > 0 && bundle &&
         (bundle->num_connections >= max_host_connections)) {
        struct connectdata *conn_candidate;

        /* The bundle is full. Extract the oldest connection. */
        conn_candidate = Curl_conncache_extract_bundle(data, bundle);
        Curl_conncache_unlock(conn);

        if(conn_candidate)
          (void)Curl_disconnect(data, conn_candidate,
                                /* dead_connection */ FALSE);
        else {
          infof(data, "No more connections allowed to host: %zu\n",
                max_host_connections);
          connections_available = FALSE;
        }
      }
      else
        Curl_conncache_unlock(conn);

    }

    if(connections_available &&
       (max_total_connections > 0) &&
       (Curl_conncache_size(data) >= max_total_connections)) {
      struct connectdata *conn_candidate;

      /* The cache is full. Let's see if we can kill a connection. */
      conn_candidate = Curl_conncache_extract_oldest(data);
      if(conn_candidate)
        (void)Curl_disconnect(data, conn_candidate,
                              /* dead_connection */ FALSE);
      else {
        infof(data, "No connections available in cache\n");
        connections_available = FALSE;
      }
    }

    if(!connections_available) {
      infof(data, "No connections available.\n");

      conn_free(conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      result = Curl_conncache_add_conn(data->state.conn_cache, conn);
      if(result)
        goto out;
    }

#if defined(USE_NTLM)
    /* If NTLM is requested in a part of this connection, make sure we don't
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked!\n");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked!\n");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  /*
   * Inherit the proper values from the urldata struct AFTER we have arranged
   * the persistent connection stuff
   */
  conn->seek_func = data->set.seek_func;
  conn->seek_client = data->set.seek_client;

  /*************************************************************
   * Resolve the address of the server or proxy
   *************************************************************/
  result = resolve_server(data, conn, async);

out:
  return result;
}